

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_1::FrontFacingFragmentShader::shadeFragments
          (FrontFacingFragmentShader *this,FragmentPacket *param_1,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  GenericVec4 *pGVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  Vec4 color;
  Vector<float,_4> local_20;
  
  tcu::Vector<float,_4>::Vector(&local_20);
  uVar3 = 0;
  uVar4 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar4 = uVar3;
  }
  dVar7 = 0;
  dVar8 = 0x3f800000;
  if (context->visibleFace == FACETYPE_FRONT) {
    dVar7 = dVar8;
    dVar8 = 0;
  }
  pGVar2 = context->outputArray;
  iVar1 = context->numFragmentOutputs;
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      iVar6 = ((uint)lVar5 | (int)uVar3 * 4) * iVar1;
      pGVar2[iVar6].v.uData[0] = dVar7;
      pGVar2[iVar6].v.uData[1] = dVar8;
      pGVar2[iVar6].v.uData[2] = 0;
      pGVar2[iVar6].v.uData[3] = 0x3f800000;
    }
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* , const int numPackets, const rr::FragmentShadingContext& context) const
	{
		tcu::Vec4 color;
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; ++fragNdx)
			{
				if (context.visibleFace == rr::FACETYPE_FRONT)
					color = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
				else
					color = tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
				rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			}
		}
	}